

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

shared_ptr<libtorrent::aux::torrent> __thiscall
libtorrent::aux::session_impl::delay_load_torrent
          (session_impl *this,info_hash_t *info_hash,peer_connection *pc)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 uVar3;
  char cVar4;
  long in_RCX;
  peer_connection *extraout_RDX;
  peer_connection *extraout_RDX_00;
  undefined8 *puVar5;
  shared_ptr<libtorrent::aux::torrent> sVar6;
  torrent_handle handle;
  error_code ec;
  add_torrent_params p;
  undefined1 local_3d0 [24];
  lsd_callback local_3b8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_3b0;
  element_type *local_3a8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> a_Stack_3a0 [4];
  add_torrent_params local_380;
  
  puVar5 = *(undefined8 **)(info_hash[0xa0].v2.m_number._M_elems + 7);
  puVar1 = *(undefined8 **)(info_hash[0xa1].v1.m_number._M_elems + 1);
  local_3d0._16_8_ = this;
  a_Stack_3a0[2]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)info_hash;
  a_Stack_3a0[3]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pc;
  do {
    if (puVar5 == puVar1) {
      *(_func_int **)local_3d0._16_8_ = (_func_int *)0x0;
      (((dht_observer *)(local_3d0._16_8_ + 8))->super_dht_logger)._vptr_dht_logger =
           (_func_int **)0x0;
LAB_00293a36:
      sVar6.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pc;
      sVar6.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_3d0._16_8_;
      return (shared_ptr<libtorrent::aux::torrent>)
             sVar6.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
    }
    add_torrent_params::add_torrent_params(&local_380);
    plVar2 = (long *)*puVar5;
    ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::peer_connection,void>
              ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
               local_3d0,
               (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
               (in_RCX + 0x88));
    ::std::__weak_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libtorrent::aux::peer_connection,void>
              ((__weak_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)&local_3b8
               ,(__shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
                local_3d0);
    local_3a8 = (element_type *)local_3b8._vptr_lsd_callback;
    a_Stack_3a0[0]._M_pi = _Stack_3b0._M_pi;
    local_3b8._vptr_lsd_callback = (_func_int **)0x0;
    _Stack_3b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cVar4 = (**(code **)(*plVar2 + 0x40))(plVar2,a_Stack_3a0[3]._M_pi,&local_3a8,&local_380);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(a_Stack_3a0);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_3b0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3d0 + 8));
    if (cVar4 != '\0') {
      local_3a8 = (element_type *)((ulong)local_3a8 & 0xffffff0000000000);
      a_Stack_3a0[0]._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           &boost::system::detail::cat_holder<void>::system_category_instance;
      add_torrent((session_impl *)local_3d0,(add_torrent_params *)a_Stack_3a0[2]._M_pi,
                  (error_code *)&local_380);
      uVar3 = local_3d0._16_8_;
      torrent_handle::native_handle((torrent_handle *)local_3d0._16_8_);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_3d0 + 8));
      add_torrent_params::~add_torrent_params(&local_380);
      pc = extraout_RDX_00;
      local_3d0._16_8_ = uVar3;
      goto LAB_00293a36;
    }
    add_torrent_params::~add_torrent_params(&local_380);
    puVar5 = puVar5 + 2;
    pc = extraout_RDX;
  } while( true );
}

Assistant:

std::shared_ptr<torrent> session_impl::delay_load_torrent(info_hash_t const& info_hash
		, peer_connection* pc)
	{
#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& e : m_ses_extensions[plugins_all_idx])
		{
			add_torrent_params p;
			if (e->on_unknown_torrent(info_hash, peer_connection_handle(pc->self()), p))
			{
				error_code ec;
				torrent_handle handle = add_torrent(std::move(p), ec);

				return handle.native_handle();
			}
		}
#else
		TORRENT_UNUSED(pc);
		TORRENT_UNUSED(info_hash);
#endif
		return std::shared_ptr<torrent>();
	}